

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

Expression * __thiscall
soul::ResolutionPass::ConstantFolder::visit(ConstantFolder *this,BinaryOperator *b)

{
  size_t *psVar1;
  Category CVar2;
  Structure *o;
  bool bVar3;
  int iVar4;
  pool_ptr<soul::AST::Constant> rhsConst;
  pool_ptr<soul::AST::Constant> lhsConst;
  Value result;
  long local_108;
  long local_100;
  anon_class_8_1_54a39802 local_f8;
  Value local_f0;
  Value local_b0;
  Value local_70;
  
  RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,&b->lhs);
  RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,&b->rhs);
  iVar4 = (*(b->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(b);
  if ((char)iVar4 != '\0') {
    SanityCheckPass::throwErrorIfNotReadableValue((b->rhs).object);
    iVar4 = (*(b->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[9])(b);
    if ((char)iVar4 == '\0') {
      SanityCheckPass::throwErrorIfNotReadableValue((b->lhs).object);
      AST::BinaryOperator::resolveOpTypes(b);
      CVar2 = (b->resolvedOpTypes).operandType.category;
      o = (b->resolvedOpTypes).operandType.structure.object;
      if (o != (Structure *)0x0) {
        (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
      }
      if (((CVar2 != invalid) &&
          ((*(((b->lhs).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_100),
          local_100 != 0)) &&
         ((*(((b->rhs).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_108),
         local_108 != 0)) {
        if (local_100 == 0) {
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        soul::Value::Value(&local_f0,(Value *)(local_100 + 0x30));
        if (local_108 == 0) {
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        soul::Value::Value(&local_b0,(Value *)(local_108 + 0x30));
        local_f8.b = b;
        bVar3 = BinaryOp::
                apply<soul::ResolutionPass::ConstantFolder::visit(soul::AST::BinaryOperator&)::_lambda(soul::CompileMessage)_1_>
                          (&local_f0,&local_b0,b->operation,&local_f8);
        soul::Value::~Value(&local_b0);
        if (bVar3) {
          soul::Value::Value(&local_70,&local_f0);
          b = (BinaryOperator *)
              PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context_const&,soul::Value>
                        (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,
                         &(b->super_Expression).super_Statement.super_ASTObject.context,&local_70);
          soul::Value::~Value(&local_70);
        }
        soul::Value::~Value(&local_f0);
      }
      RefCountedPtr<soul::Structure>::decIfNotNull(o);
      return &b->super_Expression;
    }
  }
  psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).numFails;
  *psVar1 = *psVar1 + 1;
  return &b->super_Expression;
}

Assistant:

AST::Expression& visit (AST::BinaryOperator& b) override
        {
            super::visit (b);

            if (failIfNotResolved (b))
                return b;

            SanityCheckPass::throwErrorIfNotReadableValue (b.rhs);

            if (b.isOutputEndpoint())
            {
                ++numFails;
                return b;
            }

            SanityCheckPass::throwErrorIfNotReadableValue (b.lhs);
            auto resultType = b.getOperandType();

            if (resultType.isValid())
            {
                if (auto lhsConst = b.lhs->getAsConstant())
                {
                    if (auto rhsConst = b.rhs->getAsConstant())
                    {
                        auto result = lhsConst->value;

                        if (BinaryOp::apply (result, rhsConst->value, b.operation,
                                             [&] (CompileMessage message) { b.context.throwError (message); }))
                            return createConstant (b.context, std::move (result));
                    }
                }
            }

            return b;
        }